

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool Memory::Recycler::DoProfileAllocTracker(void)

{
  bool bVar1;
  bool local_b;
  byte local_a;
  byte local_9;
  bool doTracker;
  
  local_a = 1;
  if (((Js::Configuration::Global[0x5ed2] & 1) == 0) &&
     (local_a = 1, (Js::Configuration::Global[0x5ed3] & 1) == 0)) {
    local_a = Js::Configuration::Global[0x5ed5];
  }
  local_9 = local_a & 1;
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)Js::Configuration::Global,LeakReportFlag);
  if (bVar1) {
    local_9 = 1;
  }
  if ((Js::Configuration::Global[0xe5] & 1) != 0) {
    local_9 = 1;
  }
  if ((Js::Configuration::Global[0x2c159] & 1) != 0) {
    local_9 = 1;
  }
  local_b = true;
  if (local_9 == 0) {
    local_b = MemoryProfiler::DoTrackRecyclerAllocation();
  }
  return local_b;
}

Assistant:

bool
Recycler::DoProfileAllocTracker()
{
    bool doTracker = false;
#ifdef RECYCLER_DUMP_OBJECT_GRAPH
    doTracker = Js::Configuration::Global.flags.DumpObjectGraphOnExit
        || Js::Configuration::Global.flags.DumpObjectGraphOnCollect
        || Js::Configuration::Global.flags.DumpObjectGraphOnEnum;
#endif
#ifdef LEAK_REPORT
    if (Js::Configuration::Global.flags.IsEnabled(Js::LeakReportFlag))
    {
        doTracker = true;
    }
#endif
#ifdef CHECK_MEMORY_LEAK
    if (Js::Configuration::Global.flags.CheckMemoryLeak)
    {
        doTracker = true;
    }
#endif
    if (CONFIG_FLAG(KeepRecyclerTrackData))
    {
        doTracker = true;
    }
    return doTracker || MemoryProfiler::DoTrackRecyclerAllocation();
}